

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

void cJSON_Minify(char *json)

{
  byte bVar1;
  char *into;
  byte *pbVar2;
  
  pbVar2 = (byte *)json;
LAB_0016e929:
  bVar1 = *pbVar2;
  if (bVar1 < 0x20) {
    if (bVar1 < 10) {
      if (bVar1 == 9) goto LAB_0016e95b;
      if (bVar1 == 0) {
        *json = 0;
        return;
      }
    }
    else if ((bVar1 == 10) || (bVar1 == 0xd)) {
LAB_0016e95b:
      pbVar2 = pbVar2 + 1;
      goto LAB_0016e929;
    }
  }
  else if (bVar1 == 0x2f) {
    if (pbVar2[1] == 0x2f) {
      for (; (*pbVar2 != 0 && (*pbVar2 != 10)); pbVar2 = pbVar2 + 1) {
      }
      goto LAB_0016e929;
    }
    if (pbVar2[1] == 0x2a) {
      pbVar2 = pbVar2 + 2;
      do {
        if (pbVar2[-2] == 0x2a) {
          if (pbVar2[-1] == 0x2f) goto LAB_0016e929;
        }
        else if (pbVar2[-2] == 0) goto LAB_0016e929;
        pbVar2 = pbVar2 + 1;
      } while( true );
    }
  }
  else {
    if (bVar1 == 0x22) {
      do {
        *json = bVar1;
        bVar1 = pbVar2[1];
        if (bVar1 == 0x5c) {
          pbVar2 = pbVar2 + 2;
          ((byte *)json)[1] = 0x5c;
          json = (char *)((byte *)json + 2);
        }
        else {
          if ((bVar1 == 0) || (bVar1 == 0x22)) goto LAB_0016e9e6;
          json = (char *)((byte *)json + 1);
          pbVar2 = pbVar2 + 1;
        }
        bVar1 = *pbVar2;
      } while( true );
    }
    if (bVar1 == 0x20) goto LAB_0016e95b;
  }
  pbVar2 = pbVar2 + 1;
  *json = bVar1;
  json = (char *)((byte *)json + 1);
  goto LAB_0016e929;
LAB_0016e9e6:
  pbVar2 = pbVar2 + 2;
  ((byte *)json)[1] = bVar1;
  json = (char *)((byte *)json + 2);
  goto LAB_0016e929;
}

Assistant:

void
cJSON_Minify(char *json)
{
    char *into = json;
    while (*json) {
        if (*json == ' ')
            json++;
        else if (*json == '\t')
            json++; // Whitespace characters.
        else if (*json == '\r')
            json++;
        else if (*json == '\n')
            json++;
        else if (*json == '/' && json[1] == '/')
            while (*json && *json != '\n')
                json++; // double-slash comments, to end of line.
        else if (*json == '/' && json[1] == '*') {
            while (*json && !(*json == '*' && json[1] == '/'))
                json++;
            json += 2;
        } // multiline comments.
        else if (*json == '\"') {
            *into++ = *json++;
            while (*json && *json != '\"') {
                if (*json == '\\')
                    *into++ = *json++;
                *into++ = *json++;
            }
            *into++ = *json++;
        } // string literals, which are \" sensitive.
        else
            *into++ = *json++; // All other characters.
    }
    *into = 0; // and null-terminate.
}